

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

void * __thiscall
DeviceTy::getTgtPtrBegin
          (DeviceTy *this,void *HstPtrBegin,int64_t Size,bool *IsLast,bool UpdateRefCount)

{
  reference pHVar1;
  byte *in_RCX;
  void *in_RDX;
  DeviceTy *in_RSI;
  byte in_R8B;
  LookupResult LVar2;
  uintptr_t tp;
  HostDataToTargetTy *HT;
  LookupResult lr;
  void *rc;
  mutex *in_stack_ffffffffffffffb0;
  byte local_40;
  void *local_30;
  
  local_30 = (void *)0x0;
  std::mutex::lock(in_stack_ffffffffffffffb0);
  LVar2 = lookupMapping(in_RSI,in_RDX,(int64_t)in_RCX);
  local_40 = LVar2.Flags._0_1_;
  if (((((undefined1  [16])LVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      ((local_40 >> 1 & 1) == 0)) && ((local_40 >> 2 & 1) == 0)) {
    *in_RCX = 0;
  }
  else {
    pHVar1 = std::_List_iterator<HostDataToTargetTy>::operator*
                       ((_List_iterator<HostDataToTargetTy> *)0x103829);
    *in_RCX = (1 < pHVar1->RefCount ^ 0xffU) & 1;
    if ((1 < pHVar1->RefCount) && ((in_R8B & 1) != 0)) {
      pHVar1->RefCount = pHVar1->RefCount + -1;
    }
    local_30 = (void *)((long)in_RSI + (pHVar1->TgtPtrBegin - pHVar1->HstPtrBegin));
  }
  std::mutex::unlock((mutex *)0x1038af);
  return local_30;
}

Assistant:

void *DeviceTy::getTgtPtrBegin(void *HstPtrBegin, int64_t Size, bool &IsLast,
    bool UpdateRefCount) {
  void *rc = NULL;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);

  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    IsLast = !(HT.RefCount > 1);

    if (HT.RefCount > 1 && UpdateRefCount)
      --HT.RefCount;

    uintptr_t tp = HT.TgtPtrBegin + ((uintptr_t)HstPtrBegin - HT.HstPtrBegin);
    DP("Mapping exists with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD ", "
        "Size=%ld,%s RefCount=%s\n", DPxPTR(HstPtrBegin), DPxPTR(tp), Size,
        (UpdateRefCount ? " updated" : ""),
        (CONSIDERED_INF(HT.RefCount)) ? "INF" :
            std::to_string(HT.RefCount).c_str());
    rc = (void *)tp;
  } else {
    IsLast = false;
  }

  DataMapMtx.unlock();
  return rc;
}